

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int arbsvn_commit(igsc_device_handle *handle)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint8_t fw_error;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = 0;
  iVar2 = 3;
  do {
    uVar1 = igsc_device_commit_arb_svn(handle,&local_29);
    if (uVar1 != 0xd) break;
    usleep(2000000);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (uVar1 == 0) {
    puts("ARB SVN Commit succeeded");
  }
  else if (quiet == '\0') {
    fprintf(_stderr,"Error: ARB SVN Commit failed with return value %d, firmware error is %u\n",
            (ulong)uVar1,(ulong)local_29);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int arbsvn_commit(struct igsc_device_handle *handle)
{
    int ret;
    uint8_t fw_error = 0;
    unsigned int retries = 0;

    while ((ret = igsc_device_commit_arb_svn(handle, &fw_error)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }

    if (ret == IGSC_SUCCESS)
    {
       printf("ARB SVN Commit succeeded\n");
    }
    else
    {
       fwupd_error("ARB SVN Commit failed with return value %d, firmware error is %u\n",
                   ret, fw_error);
    }
    return ret;
}